

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O2

void __thiscall
ExampleNLFeeder::
FeedDefinedVariables<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::DefVarWriterFactory>
          (ExampleNLFeeder *this,int i,DefVarWriterFactory *dvw)

{
  int i_00;
  int nnz;
  pointer piVar1;
  DefVarWriter DVar2;
  ExprArgWriter ew;
  SparseDblVecWriter linw;
  ExprArgWriter local_68;
  SparseVectorWriter<int,_double> local_58;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  ExampleModel::DefVarsInItem((vector<int,_std::allocator<int>_> *)&local_48,this->mdl_,i);
  for (piVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
      piVar1 != local_48._M_impl.super__Vector_impl_data._M_finish; piVar1 = piVar1 + 1) {
    i_00 = *piVar1;
    nnz = CountNNZ<double[2]>(this,this->mdl_->dvar_linpart + i_00);
    DVar2 = mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::
            DefVarWriterFactory::StartDefVar(dvw,i_00 + 2,nnz,this->mdl_->dvar_name[i_00]);
    local_58.n_entries_ = (size_t)DVar2.nnzlin_;
    local_58.p_nlw_ = DVar2.nlw_;
    WriteDense2Sparse_Pure<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::SparseVectorWriter<int,double>,2ul>
              (this,&local_58,this->mdl_->dvar_linpart + i_00);
    local_68.nargs_ = 1;
    local_68.nlw_ = DVar2.nlw_;
    ExampleModel::
    WriteDVarExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
              (this->mdl_,i_00,&local_68);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FeedDefinedVariables(int i, DefVarWriterFactory& dvw) {
    for (int dvar0: Model().DefVarsInItem(i)) {
      int lin_nnz = CountNNZ(Model().dvar_linpart[dvar0]);
      auto dv = dvw.StartDefVar(
            dvar0 + Model().n_var,  // index after direct vars
            lin_nnz, Model().dvar_name[dvar0]);
      /////////// Write the linear part:
      auto linw = dv.GetLinExprWriter();
      WriteDense2Sparse_Pure(linw,
                             Model().dvar_linpart[dvar0]);
      /////////// Write the expression tree:
      auto ew = dv.GetExprWriter();
      Model().WriteDVarExpr(dvar0, ew);
    }
  }